

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_multiply(void *pA,void *pB,void *pC,Integer nelems,Integer type)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  DoubleComplex *cptr_6;
  DoubleComplex *bptr_6;
  DoubleComplex *aptr_6;
  SingleComplex *cptr_5;
  SingleComplex *bptr_5;
  SingleComplex *aptr_5;
  double *cptr_4;
  double *bptr_4;
  double *aptr_4;
  float *cptr_3;
  float *bptr_3;
  float *aptr_3;
  longlong *cptr_2;
  longlong *bptr_2;
  longlong *aptr_2;
  long *cptr_1;
  long *bptr_1;
  long *aptr_1;
  int *cptr;
  int *bptr;
  int *aptr;
  Integer in_stack_000000b8;
  int i;
  int local_2c;
  
  switch(in_R8) {
  case 0x3e9:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(int *)(in_RDX + (long)local_2c * 4) =
           *(int *)(in_RDI + (long)local_2c * 4) * *(int *)(in_RSI + (long)local_2c * 4);
    }
    break;
  case 0x3ea:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(long *)(in_RDX + (long)local_2c * 8) =
           *(long *)(in_RDI + (long)local_2c * 8) * *(long *)(in_RSI + (long)local_2c * 8);
    }
    break;
  case 0x3eb:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(float *)(in_RDX + (long)local_2c * 4) =
           *(float *)(in_RDI + (long)local_2c * 4) * *(float *)(in_RSI + (long)local_2c * 4);
    }
    break;
  case 0x3ec:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(double *)(in_RDX + (long)local_2c * 8) =
           *(double *)(in_RDI + (long)local_2c * 8) * *(double *)(in_RSI + (long)local_2c * 8);
    }
    break;
  default:
    pnga_error((char *)type,in_stack_000000b8);
    break;
  case 0x3ee:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(float *)(in_RDX + (long)local_2c * 8) =
           *(float *)(in_RDI + (long)local_2c * 8) * *(float *)(in_RSI + (long)local_2c * 8) +
           -(*(float *)(in_RDI + 4 + (long)local_2c * 8) *
            *(float *)(in_RSI + 4 + (long)local_2c * 8));
      *(float *)(in_RDX + 4 + (long)local_2c * 8) =
           *(float *)(in_RDI + (long)local_2c * 8) * *(float *)(in_RSI + 4 + (long)local_2c * 8) +
           *(float *)(in_RDI + 4 + (long)local_2c * 8) * *(float *)(in_RSI + (long)local_2c * 8);
    }
    break;
  case 0x3ef:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(double *)(in_RDX + (long)local_2c * 0x10) =
           *(double *)(in_RDI + (long)local_2c * 0x10) * *(double *)(in_RSI + (long)local_2c * 0x10)
           + -(*(double *)(in_RDI + (long)local_2c * 0x10 + 8) *
              *(double *)(in_RSI + (long)local_2c * 0x10 + 8));
      *(double *)(in_RDX + (long)local_2c * 0x10 + 8) =
           *(double *)(in_RDI + (long)local_2c * 0x10) *
           *(double *)(in_RSI + (long)local_2c * 0x10 + 8) +
           *(double *)(in_RDI + (long)local_2c * 0x10 + 8) *
           *(double *)(in_RSI + (long)local_2c * 0x10);
    }
    break;
  case 0x3f8:
    for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
      *(long *)(in_RDX + (long)local_2c * 8) =
           *(long *)(in_RDI + (long)local_2c * 8) * *(long *)(in_RSI + (long)local_2c * 8);
    }
  }
  return;
}

Assistant:

static void do_multiply(void *pA, void *pB, void *pC, Integer nelems, Integer type){
#if 1
    int i;
    switch (type) {
#define TYPE_CASE(MT,T,AT)                                                  \
        case MT:                                                            \
            {                                                               \
                const T* const restrict aptr = (const T* const restrict)pA; \
                const T* const restrict bptr = (const T* const restrict)pB; \
                T* const restrict cptr = (T* const restrict)pC;             \
                for (i=0; i<nelems; i++) {                                  \
                    assign_mul_##AT(cptr[i],aptr[i],bptr[i]);               \
                }                                                           \
                break;                                                      \
            }
#include "types.xh"
#undef TYPE_CASE
        default: pnga_error("do_multiply:wrong data type ",type);
    }
#else
  Integer i;
  
  switch(type){
    double aReal, aImag, bReal, bImag;
    
  case C_DBL:
    for(i = 0; i<nelems; i++)
      ((double*)pC)[i]= ((double*)pA)[i]*((double*)pB)[i]; 
    break;
  case C_DCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((DoubleComplex*)pA)[i].real; 
      bReal = ((DoubleComplex*)pB)[i].real; 
      aImag = ((DoubleComplex*)pA)[i].imag; 
      bImag = ((DoubleComplex*)pB)[i].imag; 
      ((DoubleComplex*)pC)[i].real = aReal*bReal-aImag*bImag;
      ((DoubleComplex*)pC)[i].imag = aReal*bImag+aImag*bReal;
    }
    break;
  case C_SCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((SingleComplex*)pA)[i].real; 
      bReal = ((SingleComplex*)pB)[i].real; 
      aImag = ((SingleComplex*)pA)[i].imag; 
      bImag = ((SingleComplex*)pB)[i].imag; 
      ((SingleComplex*)pC)[i].real = aReal*bReal-aImag*bImag;
      ((SingleComplex*)pC)[i].imag = aReal*bImag+aImag*bReal;
    }
    break;
  case C_INT:
    for(i = 0; i<nelems; i++)
      ((int*)pC)[i] = ((int*)pA)[i]* ((int*)pB)[i];
    break;
  case C_FLOAT:
    for(i = 0; i<nelems; i++)
      ((float*)pC)[i]=  ((float*)pA)[i]*((float*)pB)[i];
    break;
  case C_LONG:
    for(i = 0; i<nelems; i++)
      ((long *)pC)[i]= ((long *)pA)[i]* ((long *)pB)[i];
    break;
    
  default: pnga_error(" wrong data type ",type);
  }
#endif
}